

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerEqualityCompare(Lowerer *this,Instr *instr,JnHelperMethod helper)

{
  IRType IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  JnHelperMethod helperMethod;
  ushort uVar6;
  Instr *local_40;
  Instr *instrPrev;
  bool fNoLower;
  bool needHelper;
  
  local_40 = instr->m_prev;
  instrPrev._7_1_ = '\x01';
  instrPrev._6_1_ = '\0';
  IVar1 = instr->m_src1->m_type;
  if ((byte)(IVar1 - TyFloat32) < 2) {
    if (IVar1 != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x287b,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    LowererMD::GenerateFastCmXxR8(&this->m_lowererMD,instr);
    goto LAB_005b1b77;
  }
  OVar2 = instr->m_opcode;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,BranchFastPathPhase,sourceContextId,functionId);
  if ((!bVar4) && (bVar4 = Func::DoFastPaths(this->m_func), bVar4)) {
    bVar4 = IR::Instr::IsNeq(instr);
    bVar4 = TryGenerateFastBrOrCmTypeOf(this,instr,&local_40,bVar4,(bool *)((long)&instrPrev + 6));
    if (bVar4) {
      if (instrPrev._6_1_ != '\0') goto LAB_005b1b77;
    }
    else {
      uVar6 = OVar2 - CmSrEq_A;
      if ((uVar6 < 2) && (bVar4 = TryGenerateFastCmSrXx(this,instr), bVar4)) goto LAB_005b1b77;
      bVar4 = GenerateFastBrOrCmString(this,instr);
      if (!bVar4) {
        if ((uVar6 < 2) &&
           (bVar4 = GenerateFastBrOrCmEqDefinite
                              (this,instr,helperMethod,(bool *)((long)&instrPrev + 7),false,false),
           bVar4)) {
          if (instrPrev._7_1_ != '\x01') goto LAB_005b1b77;
        }
        else {
          bVar4 = GenerateFastCmEqLikely(this,instr,(bool *)((long)&instrPrev + 7),false);
          if ((bVar4) ||
             (bVar4 = GenerateFastEqBoolInt(this,instr,(bool *)((long)&instrPrev + 7),false), bVar4)
             ) {
            if (instrPrev._7_1_ != '\x01') goto LAB_005b1b77;
            if (uVar6 < 2) {
              bVar4 = true;
              goto LAB_005b1c43;
            }
          }
          else {
            bVar4 = LowererMD::GenerateFastCmXxTaggedInt(&this->m_lowererMD,instr,false);
            if (bVar4) goto LAB_005b1b77;
            if (uVar6 < 2) {
              bVar4 = false;
LAB_005b1c43:
              LowerStrictBrOrCm(this,instr,helper,false,false,bVar4);
              goto LAB_005b1b77;
            }
          }
        }
      }
    }
  }
  LowerBinaryHelperMem(this,instr,helper);
LAB_005b1b77:
  if (instrPrev._7_1_ == '\0') {
    IR::Instr::Remove(instr);
  }
  return local_40;
}

Assistant:

IR::Instr *
Lowerer::LowerEqualityCompare(IR::Instr* instr, IR::JnHelperMethod helper)
{
    IR::Instr * instrPrev = instr->m_prev;
    bool needHelper = true;
    bool fNoLower = false;
    bool isStrictCompare = instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A;

    if (instr->GetSrc1()->IsFloat())
    {
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        this->m_lowererMD.GenerateFastCmXxR8(instr);
    }
    else if (PHASE_OFF(Js::BranchFastPathPhase, m_func) || !m_func->DoFastPaths())
    {
        LowerBinaryHelperMem(instr, helper);
    }
    else if (TryGenerateFastBrOrCmTypeOf(instr, &instrPrev, instr->IsNeq(), &fNoLower))
    {
        if (!fNoLower)
        {
            LowerBinaryHelperMem(instr, helper);
        }
    }
    else if (isStrictCompare && TryGenerateFastCmSrXx(instr))
    {
    }
    else
    {
        if (GenerateFastBrOrCmString(instr))
        {
            LowerBinaryHelperMem(instr, helper);
        }
        else if (isStrictCompare && GenerateFastBrOrCmEqDefinite(instr, helper, &needHelper, false, false))
        {
            if (needHelper)
            {
                LowerBinaryHelperMem(instr, helper);
            }
        }
        else if(GenerateFastCmEqLikely(instr, &needHelper, false) || GenerateFastEqBoolInt(instr, &needHelper, false))
        {
            if (needHelper)
            {
                if (isStrictCompare)
                {
                    LowerStrictBrOrCm(instr, helper, false, false /* isBranch */, true);
                }
                else
                {
                    LowerBinaryHelperMem(instr, helper);
                }
            }
        }
        else if (!m_lowererMD.GenerateFastCmXxTaggedInt(instr, false))
        {
            if (isStrictCompare)
            {
                LowerStrictBrOrCm(instr, helper, false, false /* isBranch */, false);
            }
            else
            {
                LowerBinaryHelperMem(instr, helper);
            }
        }
    }
    if (!needHelper)
    {
        instr->Remove();
    }
    return instrPrev;
}